

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O1

int rtr_mgr_add_group(rtr_mgr_config *config,rtr_mgr_group *group)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  tommy_node_struct *ptVar4;
  rtr_mgr_group *group_00;
  int iVar5;
  tommy_node_struct *group_01;
  tommy_list ptVar6;
  tommy_node_struct *ptVar7;
  uint refresh_interval;
  uint retry_interval;
  pthread_rwlock_t *__rwlock;
  rtr_interval_mode in_R9D;
  uint expire_interval;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __rwlock = &config->mutex;
  pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  ptVar6 = config->groups->list;
  if (ptVar6 == (tommy_list)0x0) {
    refresh_interval = 0xe10;
    retry_interval = 600;
    expire_interval = 0x1c20;
  }
  else {
    expire_interval = 0x1c20;
    retry_interval = 600;
    refresh_interval = 0xe10;
    do {
      puVar2 = *(undefined8 **)((long)ptVar6->data + 0x20);
      if (*(uint8_t *)((long)puVar2 + 0xc) == group->preference) {
        group_01 = (tommy_node_struct *)0x0;
        lrtr_dbg("RTR_MGR: Group with preference value already exists!");
        iVar5 = -2;
        goto LAB_00106abe;
      }
      lVar3 = *(long *)*puVar2;
      if (*(uint *)(lVar3 + 8) != 0) {
        refresh_interval = *(uint *)(lVar3 + 8);
      }
      if (*(uint *)(lVar3 + 0x1c) != 0) {
        retry_interval = *(uint *)(lVar3 + 0x1c);
      }
      if (*(uint *)(lVar3 + 0x18) != 0) {
        expire_interval = *(uint *)(lVar3 + 0x18);
      }
      ptVar6 = ptVar6->next;
    } while (ptVar6 != (tommy_node_struct *)0x0);
  }
  group_01 = (tommy_node_struct *)lrtr_malloc(0x18);
  if (group_01 == (tommy_node_struct *)0x0) {
    iVar5 = -1;
    group_01 = (tommy_node_struct *)0x0;
  }
  else {
    group_01->data = *(void **)&group->status;
    ptVar4 = *(tommy_node_struct **)&group->sockets_len;
    group_01->next = (tommy_node_struct *)group->sockets;
    group_01->prev = ptVar4;
    *(rtr_mgr_status *)&group_01->data = RTR_MGR_CLOSED;
    iVar5 = rtr_mgr_init_sockets
                      ((rtr_mgr_group *)group_01,config,refresh_interval,expire_interval,
                       retry_interval,in_R9D);
    if (iVar5 == 0) {
      ptVar6 = (tommy_list)lrtr_malloc(0x28);
      if (ptVar6 != (tommy_list)0x0) {
        ptVar6[1].next = group_01;
        ptVar7 = (tommy_node_struct *)config->groups;
        ptVar4 = ptVar7->next;
        if (ptVar4 == (tommy_node_struct *)0x0) {
          ptVar6->prev = ptVar6;
          ptVar6->next = (tommy_node_struct *)0x0;
        }
        else {
          ptVar6->prev = ptVar4->prev;
          ptVar4->prev = ptVar6;
          ptVar6->next = (tommy_node_struct *)0x0;
          ptVar7 = ptVar6->prev;
        }
        ptVar7->next = ptVar6;
        ptVar6->data = ptVar6;
        config->len = config->len + 1;
        iVar5 = 0;
        lrtr_dbg("RTR_MGR: Group with preference %d successfully added!",
                 (ulong)*(uint8_t *)((long)&group_01->prev + 4));
        tommy_list_sort(&config->groups->list,rtr_mgr_config_cmp_tommy);
        group_00 = *(rtr_mgr_group **)((long)config->groups->list->data + 0x20);
        if (group_00->status == RTR_MGR_CLOSED) {
          rtr_mgr_start_sockets(group_00);
        }
        pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
        goto LAB_00106ad5;
      }
      iVar5 = 0;
    }
  }
LAB_00106abe:
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  if (group_01 != (tommy_node_struct *)0x0) {
    lrtr_free(group_01);
  }
LAB_00106ad5:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_add_group(struct rtr_mgr_config *config, const struct rtr_mgr_group *group)
{
	unsigned int refresh_iv = 3600;
	unsigned int retry_iv = 600;
	unsigned int expire_iv = 7200;
	enum rtr_interval_mode iv_mode = RTR_INTERVAL_MODE_DEFAULT_MIN_MAX;
	enum rtr_rtvals err_code = RTR_ERROR;
	struct rtr_mgr_group_node *new_group_node = NULL;
	struct rtr_mgr_group *new_group = NULL;
	struct rtr_mgr_group_node *gnode;

	pthread_rwlock_wrlock(&config->mutex);

	tommy_node *node = tommy_list_head(&config->groups->list);

	while (node) {
		gnode = node->data;
		if (gnode->group->preference == group->preference) {
			MGR_DBG1("Group with preference value already exists!");
			err_code = RTR_INVALID_PARAM;
			goto err;
		}

		// TODO: This is not pretty. It wants to get the same intervals
		// that are being used by other groups. Maybe intervals should
		// be store globally/per-group/per-socket?
		if (gnode->group->sockets[0]->refresh_interval)
			refresh_iv = gnode->group->sockets[0]->refresh_interval;
		if (gnode->group->sockets[0]->retry_interval)
			retry_iv = gnode->group->sockets[0]->retry_interval;
		if (gnode->group->sockets[0]->expire_interval)
			expire_iv = gnode->group->sockets[0]->expire_interval;
		node = node->next;
	}
	new_group = lrtr_malloc(sizeof(struct rtr_mgr_group));

	if (!new_group)
		goto err;

	memcpy(new_group, group, sizeof(struct rtr_mgr_group));
	new_group->status = RTR_MGR_CLOSED;

	err_code = rtr_mgr_init_sockets(new_group, config, refresh_iv, expire_iv, retry_iv, iv_mode);
	if (err_code)
		goto err;

	new_group_node = lrtr_malloc(sizeof(struct rtr_mgr_group_node));
	if (!new_group_node)
		goto err;

	new_group_node->group = new_group;
	tommy_list_insert_tail(&config->groups->list, &new_group_node->node, new_group_node);
	config->len++;

	MGR_DBG("Group with preference %d successfully added!", new_group->preference);

	tommy_list_sort(&config->groups->list, &rtr_mgr_config_cmp_tommy);

	struct rtr_mgr_group *best_group = rtr_mgr_get_first_group(config);

	if (best_group->status == RTR_MGR_CLOSED)
		rtr_mgr_start_sockets(best_group);

	pthread_rwlock_unlock(&config->mutex);
	return RTR_SUCCESS;

err:
	pthread_rwlock_unlock(&config->mutex);

	if (new_group)
		lrtr_free(new_group);

	return err_code;
}